

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfArray.h
# Opt level: O2

void __thiscall
Imf_3_4::Array2D<float>::resizeEraseUnsafe(Array2D<float> *this,long sizeX,long sizeY)

{
  float *pfVar1;
  
  if (this->_data != (float *)0x0) {
    operator_delete__(this->_data);
  }
  this->_sizeX = 0;
  this->_sizeY = 0;
  this->_data = (float *)0x0;
  pfVar1 = (float *)operator_new__(-(ulong)((ulong)(sizeY * sizeX) >> 0x3e != 0) | sizeY * sizeX * 4
                                  );
  this->_data = pfVar1;
  this->_sizeX = sizeX;
  this->_sizeY = sizeY;
  return;
}

Assistant:

inline void
Array2D<T>::resizeEraseUnsafe (long sizeX, long sizeY)
{
    delete[] _data;
    _data  = 0;
    _sizeX = 0;
    _sizeY = 0;
    _data  = new T[sizeX * sizeY];
    _sizeX = sizeX;
    _sizeY = sizeY;
}